

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_save.c
# Opt level: O0

char * fwrite_flag(long flags,char *buf)

{
  char *in_RSI;
  ulong in_RDI;
  char *cp;
  char offset;
  char *local_28;
  byte local_19;
  
  *in_RSI = '\0';
  if (in_RDI == 0) {
    strcpy(in_RSI,"0");
  }
  else {
    local_28 = in_RSI;
    for (local_19 = 0; (char)local_19 < ' '; local_19 = local_19 + 1) {
      if ((in_RDI & 1L << (local_19 & 0x3f)) != 0) {
        if ((char)local_19 < '\x1a') {
          *local_28 = local_19 + 0x41;
        }
        else {
          *local_28 = local_19 + 0x47;
        }
        local_28 = local_28 + 1;
      }
    }
    *local_28 = '\0';
  }
  return in_RSI;
}

Assistant:

char *fwrite_flag(long flags, char buf[])
{
	char offset;
	char *cp;

	buf[0] = '\0';

	if (flags == 0)
	{
		strcpy(buf, "0");
		return buf;
	}

	/* 32 -- number of bits in a long */
	for (offset = 0, cp = buf; offset < 32; offset++)
	{
		if (flags & ((long)1 << offset))
		{
			if (offset <= 'Z' - 'A')
				*(cp++) = 'A' + offset;
			else
				*(cp++) = 'a' + offset - ('Z' - 'A' + 1);
		}
	}

	*cp = '\0';
	return buf;
}